

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this,_IO_FILE *f)

{
  char *pcVar1;
  char *ptr;
  char *pcVar2;
  FILE *__stream;
  
  (this->super_buffer<char>).size_ = 0;
  (this->super_buffer<char>).capacity_ = 0;
  (this->super_buffer<char>).grow_ = grow;
  (this->file_).super_file_base<_IO_FILE>.file_ = f;
  flockfile((FILE *)f);
  __stream = (FILE *)(this->file_).super_file_base<_IO_FILE>.file_;
  pcVar2 = __stream->_IO_write_ptr;
  if (pcVar2 == (char *)0x0) {
    putc_unlocked(0,__stream);
    __stream = (FILE *)(this->file_).super_file_base<_IO_FILE>.file_;
    pcVar2 = __stream->_IO_write_ptr + -1;
    __stream->_IO_write_ptr = pcVar2;
  }
  pcVar1 = __stream->_IO_buf_end;
  (this->super_buffer<char>).ptr_ = pcVar2;
  (this->super_buffer<char>).capacity_ = (long)pcVar1 - (long)pcVar2;
  return;
}

Assistant:

explicit file_print_buffer(F* f) : buffer(grow, size_t()), file_(f) {
    flockfile(f);
    file_.init_buffer();
    auto buf = file_.get_write_buffer();
    set(buf.data, buf.size);
  }